

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O2

uint32_t Hacl_Bignum4096_32_lt_mask(uint32_t *a,uint32_t *b)

{
  uint32_t b_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t i;
  long lVar3;
  uint uVar4;
  
  uVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    uVar2 = a[lVar3];
    b_00 = b[lVar3];
    uVar1 = FStar_UInt32_eq_mask(uVar2,b_00);
    uVar2 = FStar_UInt32_gte_mask(uVar2,b_00);
    uVar4 = uVar4 & uVar1 | ~(uVar2 | uVar1);
  }
  return uVar4;
}

Assistant:

uint32_t Hacl_Bignum4096_32_lt_mask(uint32_t *a, uint32_t *b)
{
  uint32_t acc = 0U;
  for (uint32_t i = 0U; i < 128U; i++)
  {
    uint32_t beq = FStar_UInt32_eq_mask(a[i], b[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], b[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
  }
  return acc;
}